

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# java_extension.cc
# Opt level: O2

int __thiscall
google::protobuf::compiler::java::ImmutableExtensionGenerator::GenerateNonNestedInitializationCode
          (ImmutableExtensionGenerator *this,Printer *printer)

{
  int iVar1;
  char *pcVar2;
  int __c;
  int i;
  FieldDescriptor *in_RDX;
  java *this_00;
  string local_50;
  string local_30;
  
  this_00 = (java *)this->descriptor_;
  iVar1 = 0;
  if (*(long *)(this_00 + 0x68) == 0) {
    UnderscoresToCamelCase_abi_cxx11_(&local_30,this_00,in_RDX);
    pcVar2 = FieldDescriptor::index(this->descriptor_,(char *)this_00,__c);
    SimpleItoa_abi_cxx11_(&local_50,(protobuf *)((ulong)pcVar2 & 0xffffffff),i);
    io::Printer::Print(printer,"$name$.internalInit(descriptor.getExtensions().get($index$));\n",
                       "name",&local_30,"index",&local_50);
    std::__cxx11::string::~string((string *)&local_50);
    std::__cxx11::string::~string((string *)&local_30);
    iVar1 = 0x15;
  }
  return iVar1;
}

Assistant:

int ImmutableExtensionGenerator::GenerateNonNestedInitializationCode(
    io::Printer* printer) {
  int bytecode_estimate = 0;
  if (descriptor_->extension_scope() == NULL) {
    // Only applies to non-nested extensions.
    printer->Print(
        "$name$.internalInit(descriptor.getExtensions().get($index$));\n",
        "name", UnderscoresToCamelCase(descriptor_),
        "index", SimpleItoa(descriptor_->index()));
    bytecode_estimate += 21;
  }
  return bytecode_estimate;
}